

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O1

void SHA256D64(uchar *out,uchar *in,size_t blocks)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((7 < blocks) && ((anonymous_namespace)::TransformD64_8way != 0)) {
    do {
      sha256d64_avx2::Transform_8way(out,in);
      out = out + 0x100;
      in = in + 0x200;
      blocks = blocks - 8;
    } while (7 < blocks);
  }
  if ((3 < blocks) && ((anonymous_namespace)::TransformD64_4way != 0)) {
    do {
      sha256d64_sse41::Transform_4way(out,in);
      out = out + 0x80;
      in = in + 0x100;
      blocks = blocks - 4;
    } while (3 < blocks);
  }
  if ((1 < blocks) && ((anonymous_namespace)::TransformD64_2way != 0)) {
    do {
      sha256d64_x86_shani::Transform_2way(out,in);
      out = out + 0x40;
      in = in + 0x80;
      blocks = blocks - 2;
    } while (1 < blocks);
  }
  for (; blocks != 0; blocks = blocks - 1) {
    (*(code *)(anonymous_namespace)::TransformD64)(out,in);
    out = out + 0x20;
    in = in + 0x40;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SHA256D64(unsigned char* out, const unsigned char* in, size_t blocks)
{
    if (TransformD64_8way) {
        while (blocks >= 8) {
            TransformD64_8way(out, in);
            out += 256;
            in += 512;
            blocks -= 8;
        }
    }
    if (TransformD64_4way) {
        while (blocks >= 4) {
            TransformD64_4way(out, in);
            out += 128;
            in += 256;
            blocks -= 4;
        }
    }
    if (TransformD64_2way) {
        while (blocks >= 2) {
            TransformD64_2way(out, in);
            out += 64;
            in += 128;
            blocks -= 2;
        }
    }
    while (blocks) {
        TransformD64(out, in);
        out += 32;
        in += 64;
        --blocks;
    }
}